

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void __thiscall
basist::decoder_etc_block::get_block_colors
          (decoder_etc_block *this,color32 *pBlock_colors,uint32_t subblock_index)

{
  uint16_t uVar1;
  uint16_t packed_delta3;
  anon_union_4_3_898e29d3_for_color32_0 aVar2;
  uint32_t uVar3;
  uint uVar4;
  undefined8 in_RAX;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  undefined4 uStack_28;
  color32 b;
  
  _uStack_28 = in_RAX;
  if (((this->field_0).m_bytes[3] & 2) == 0) {
    uVar1 = get_base4_color(this,subblock_index);
    aVar2.field_0 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
         unpack_color4(uVar1,true,0xff);
  }
  else {
    uVar1 = get_base5_color(this);
    if (subblock_index != 0) {
      packed_delta3 = get_delta3_color(this);
      unpack_color5(&b,uVar1,packed_delta3,true,0xff);
      goto LAB_001389e3;
    }
    aVar2.field_0 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
         unpack_color5(uVar1,true,0xff);
  }
  _uStack_28 = CONCAT44(aVar2.m,uStack_28);
LAB_001389e3:
  uVar3 = get_inten_table(this,subblock_index);
  uVar8 = (ulong)uVar3;
  uVar4 = (uint)b.field_0.field_0.r;
  iVar9 = (&g_etc1_inten_tables)[uVar8 * 4];
  iVar7 = iVar9 + uVar4;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  uVar5 = (uint)b.field_0.field_0.g;
  iVar6 = iVar9 + uVar5;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  iVar9 = iVar9 + (uint)b.field_0.field_0.b;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  iVar10 = (&DAT_001ce784)[uVar8 * 4];
  (pBlock_colors->field_0).field_0.r = (uint8_t)iVar7;
  (pBlock_colors->field_0).field_0.g = (uint8_t)iVar6;
  (pBlock_colors->field_0).field_0.b = (uint8_t)iVar9;
  iVar7 = iVar10 + uVar4;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  iVar9 = iVar10 + uVar5;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  (pBlock_colors->field_0).field_0.a = 0xff;
  iVar6 = 0xff;
  if (0xfe < iVar9) {
    iVar9 = iVar6;
  }
  iVar10 = iVar10 + (uint)b.field_0.field_0.b;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (0xfe < iVar10) {
    iVar10 = iVar6;
  }
  pBlock_colors[1].field_0.field_0.r = (uint8_t)iVar7;
  pBlock_colors[1].field_0.field_0.g = (uint8_t)iVar9;
  pBlock_colors[1].field_0.field_0.b = (uint8_t)iVar10;
  pBlock_colors[1].field_0.field_0.a = 0xff;
  iVar9 = (&DAT_001ce788)[uVar8 * 4];
  iVar7 = iVar9 + uVar4;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = iVar6;
  }
  iVar10 = iVar9 + uVar5;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (0xfe < iVar10) {
    iVar10 = iVar6;
  }
  iVar9 = iVar9 + (uint)b.field_0.field_0.b;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (0xfe < iVar9) {
    iVar9 = iVar6;
  }
  pBlock_colors[2].field_0.field_0.r = (uint8_t)iVar7;
  pBlock_colors[2].field_0.field_0.g = (uint8_t)iVar10;
  pBlock_colors[2].field_0.field_0.b = (uint8_t)iVar9;
  pBlock_colors[2].field_0.field_0.a = 0xff;
  iVar7 = (&DAT_001ce78c)[uVar8 * 4];
  iVar9 = uVar4 + iVar7;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  if (0xfe < iVar9) {
    iVar9 = iVar6;
  }
  iVar6 = uVar5 + iVar7;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  iVar7 = iVar7 + (uint)b.field_0.field_0.b;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  pBlock_colors[3].field_0.field_0.r = (uint8_t)iVar9;
  pBlock_colors[3].field_0.field_0.g = (uint8_t)iVar6;
  pBlock_colors[3].field_0.field_0.b = (uint8_t)iVar7;
  pBlock_colors[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void get_block_colors(color32* pBlock_colors, uint32_t subblock_index) const
		{
			color32 b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true, 255);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true, 255);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			pBlock_colors[0].set_noclamp_rgba(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set_noclamp_rgba(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set_noclamp_rgba(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set_noclamp_rgba(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}